

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall Liby::UdpSocket::UdpSocket(UdpSocket *this,EventLoop *loop,SockPtr *socket)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_Liby::Channel_*,_false> __p;
  Poller *pPVar2;
  _Head_base<0UL,_Liby::Channel_*,_false> local_38;
  
  (this->super_enable_shared_from_this<Liby::UdpSocket>)._M_weak_this.
  super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Liby::UdpSocket>)._M_weak_this.
  super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->destroy_ = false;
  this->sockfd_ =
       ((socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->fd_;
  std::__shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>,
             &socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>);
  pPVar2 = EventLoop::getPoller(loop);
  this->poller_ = pPVar2;
  this->loop_ = loop;
  (this->chan_)._M_t.super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
  super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
  super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl = (Channel *)0x0;
  (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->conns_)._M_t._M_impl.super__Rb_tree_header;
  (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::_Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::_Deque_base
            (&(this->writTasks_).
              super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>);
  memset(&this->acceptorCallback_,0,0x90);
  std::make_unique<Liby::Channel,Liby::Poller*&,int&>((Poller **)&local_38,(int *)&this->poller_);
  __p._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (Channel *)0x0;
  std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&this->chan_,
             __p._M_head_impl);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr
            ((unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&local_38);
  return;
}

Assistant:

UdpSocket::UdpSocket(EventLoop *loop, const SockPtr &socket)
    : sockfd_(socket->fd()), socket_(socket), poller_(loop->getPoller()),
      loop_(loop) {
    chan_ = std::make_unique<Channel>(poller_, sockfd_);
}